

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

int32 __thiscall
rw::PluginList::setStreamAlwaysCallback(PluginList *this,uint32 id,AlwaysCallback cb)

{
  LLLink *pLVar1;
  
  pLVar1 = &(this->plugins).link;
  do {
    pLVar1 = ((LLLink *)&pLVar1->next)->next;
    if (pLVar1 == &(this->plugins).link) {
      return -1;
    }
  } while (*(uint32 *)&pLVar1[-5].next != id);
  pLVar1[-1].next = (LLLink *)cb;
  return *(int32 *)&pLVar1[-6].prev;
}

Assistant:

int32
PluginList::setStreamAlwaysCallback(uint32 id, AlwaysCallback cb)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->alwaysCallback = cb;
			return p->offset;
		}
	}
	return -1;
}